

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_huffman_decode_char(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  int iVar2;
  cram_huffman_code *pcVar3;
  int iVar4;
  int local_64;
  int dlen;
  int last_len;
  int len;
  int val;
  int idx;
  cram_huffman_code *codes;
  int ncodes;
  int n;
  int i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  iVar1 = (c->field_6).huffman.ncodes;
  pcVar3 = (c->field_6).huffman.codes;
  ncodes = 0;
  iVar2 = *out_size;
  do {
    if (iVar2 <= ncodes) {
      return 0;
    }
    len = 0;
    last_len = 0;
    dlen = 0;
    do {
      local_64 = pcVar3[len].len - dlen;
      if ((local_64 < 1) || ((in->alloc - in->byte) * 8 + (long)in->bit + 7 < (ulong)(long)local_64)
         ) {
        return -1;
      }
      dlen = local_64 + dlen;
      for (; local_64 != 0; local_64 = local_64 + -1) {
        last_len = (int)(uint)in->data[in->byte] >> ((byte)in->bit & 0x1f) & 1U | last_len << 1;
        iVar4 = in->bit + -1;
        in->bit = iVar4;
        in->byte = (long)(int)(uint)(iVar4 < 0) + in->byte;
        in->bit = in->bit & 7;
      }
      len = last_len - pcVar3[len].p;
      if ((iVar1 <= len) || (len < 0)) {
        return -1;
      }
    } while ((pcVar3[len].code != last_len) || (pcVar3[len].len != dlen));
    out[ncodes] = (char)pcVar3[len].symbol;
    ncodes = ncodes + 1;
  } while( true );
}

Assistant:

int cram_huffman_decode_char(cram_slice *slice, cram_codec *c,
			     cram_block *in, char *out, int *out_size) {
    int i, n, ncodes = c->huffman.ncodes;
    const cram_huffman_code * const codes = c->huffman.codes;

    for (i = 0, n = *out_size; i < n; i++) {
	int idx = 0;
	int val = 0, len = 0, last_len = 0;

	for (;;) {
	    int dlen = codes[idx].len - last_len;
	    if (dlen <= 0 || (in->alloc - in->byte)*8 + in->bit + 7 < dlen)
		return -1;

	    //val <<= dlen;
	    //val  |= get_bits_MSB(in, dlen);
	    //last_len = (len += dlen);

	    last_len = (len += dlen);
	    for (; dlen; dlen--) GET_BIT_MSB(in, val);

	    idx = val - codes[idx].p;
	    if (idx >= ncodes || idx < 0)
		return -1;

	    if (codes[idx].code == val && codes[idx].len == len) {
		out[i] = codes[idx].symbol;
		break;
	    }
	}
    }

    return 0;
}